

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O0

void stbi_decode_DXT_color_block(uchar *uncompressed,uchar *compressed)

{
  int iVar1;
  byte local_40 [4];
  int idx;
  uchar decode_colors [12];
  int c1;
  int c0;
  int b;
  int g;
  int r;
  int i;
  int next_bit;
  uchar *compressed_local;
  uchar *uncompressed_local;
  
  r = 0x20;
  decode_colors._8_4_ = (uint)*compressed + (uint)compressed[1] * 0x100;
  decode_colors._4_4_ = (uint)compressed[2] + (uint)compressed[3] * 0x100;
  _i = compressed;
  compressed_local = uncompressed;
  stbi_rgb_888_from_565(decode_colors._8_4_,&b,&c0,&c1);
  local_40[0] = (byte)b;
  local_40[1] = (byte)c0;
  local_40[2] = (byte)c1;
  stbi_rgb_888_from_565(decode_colors._4_4_,&b,&c0,&c1);
  local_40[3] = (char)b;
  idx._0_1_ = (char)c0;
  idx._1_1_ = (char)c1;
  idx._2_1_ = (char)((ulong)((uint)local_40[0] * 2 + (b & 0xffU)) / 3);
  idx._3_1_ = (char)((ulong)((uint)local_40[1] * 2 + (c0 & 0xffU)) / 3);
  decode_colors[0] = (uchar)((ulong)((uint)local_40[2] * 2 + (c1 & 0xffU)) / 3);
  decode_colors[1] = (uchar)((ulong)((uint)local_40[0] + (b & 0xffU) * 2) / 3);
  decode_colors[2] = (uchar)((ulong)((uint)local_40[1] + (c0 & 0xffU) * 2) / 3);
  decode_colors[3] = (uchar)((ulong)((uint)local_40[2] + (c1 & 0xffU) * 2) / 3);
  for (g = 0; g < 0x40; g = g + 4) {
    iVar1 = ((int)(uint)_i[r >> 3] >> ((byte)r & 7) & 3U) * 3;
    r = r + 2;
    compressed_local[g] = local_40[iVar1];
    compressed_local[g + 1] = local_40[iVar1 + 1];
    compressed_local[g + 2] = local_40[iVar1 + 2];
  }
  return;
}

Assistant:

void stbi_decode_DXT_color_block(
			unsigned char uncompressed[16*4],
			unsigned char compressed[8] )
{
	int next_bit = 4*8;
	int i, r, g, b;
	int c0, c1;
	unsigned char decode_colors[4*3];
	//	find the 2 primary colors
	c0 = compressed[0] + (compressed[1] << 8);
	c1 = compressed[2] + (compressed[3] << 8);
	stbi_rgb_888_from_565( c0, &r, &g, &b );
	decode_colors[0] = r;
	decode_colors[1] = g;
	decode_colors[2] = b;
	stbi_rgb_888_from_565( c1, &r, &g, &b );
	decode_colors[3] = r;
	decode_colors[4] = g;
	decode_colors[5] = b;
	//	Like DXT1, but no choicees:
	//	no alpha, 2 interpolated colors
	decode_colors[6] = (2*decode_colors[0] + decode_colors[3]) / 3;
	decode_colors[7] = (2*decode_colors[1] + decode_colors[4]) / 3;
	decode_colors[8] = (2*decode_colors[2] + decode_colors[5]) / 3;
	decode_colors[9] = (decode_colors[0] + 2*decode_colors[3]) / 3;
	decode_colors[10] = (decode_colors[1] + 2*decode_colors[4]) / 3;
	decode_colors[11] = (decode_colors[2] + 2*decode_colors[5]) / 3;
	//	decode the block
	for( i = 0; i < 16*4; i += 4 )
	{
		int idx = ((compressed[next_bit>>3] >> (next_bit & 7)) & 3) * 3;
		next_bit += 2;
		uncompressed[i+0] = decode_colors[idx+0];
		uncompressed[i+1] = decode_colors[idx+1];
		uncompressed[i+2] = decode_colors[idx+2];
	}
	//	done
}